

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Result init_emulator(Emulator *e,EmulatorInit *init)

{
  EmulatorInit *pEVar1;
  undefined1 uVar2;
  Result RVar3;
  int *local_48;
  bool local_3b;
  bool local_3a;
  bool local_39;
  u32 local_38;
  uint local_34;
  u32 random_seed;
  int i;
  ColorPalettes *palette;
  EmulatorInit *pEStack_20;
  int pal_index;
  EmulatorInit *init_local;
  Emulator *e_local;
  
  pEStack_20 = init;
  init_local = (EmulatorInit *)e;
  RVar3 = get_cart_infos(e);
  if (RVar3 == OK) {
    log_cart_info(*(CartInfo **)&init_local[0x134].force_dmg);
    *(undefined4 *)&init_local[0x136].rom.data = 0;
    *(undefined4 *)((long)&init_local[0x136].rom.data + 4) = 0x4000;
    local_39 = false;
    if (pEStack_20->force_dmg == FALSE) {
      local_3a = true;
      if (*(int *)(*(long *)&init_local[0x134].force_dmg + 0x18) != 0x80) {
        local_3a = *(int *)(*(long *)&init_local[0x134].force_dmg + 0x18) == 0xc0;
      }
      local_39 = local_3a;
    }
    init_local[0x14b3].random_seed = (uint)local_39;
    local_3b = false;
    if ((pEStack_20->force_dmg == FALSE) && (local_3b = false, init_local[0x14b3].random_seed == 0))
    {
      local_3b = *(int *)(*(long *)&init_local[0x134].force_dmg + 0x1c) == 3;
    }
    init_local[0x14b3].builtin_palette = (uint)local_3b;
    set_af_reg((Emulator *)init_local,0xb0);
    uVar2 = 1;
    if (init_local[0x14b3].random_seed != 0) {
      uVar2 = 0x11;
    }
    *(undefined1 *)&init_local[0x137].audio_frequency = uVar2;
    *(undefined2 *)((long)&init_local[0x137].audio_frequency + 2) = 0x13;
    *(undefined2 *)&init_local[0x137].audio_frames = 0xd8;
    *(undefined2 *)((long)&init_local[0x137].audio_frames + 2) = 0x14d;
    *(undefined2 *)&init_local[0x137].random_seed = 0xfffe;
    *(undefined2 *)((long)&init_local[0x137].random_seed + 2) = 0x100;
    *(undefined4 *)((long)&init_local[0x12d2].rom.size + 4) = 0;
    *(undefined2 *)&init_local[0x148f].force_dmg = 0xac00;
    init_local[0x14b3].audio_frequency = -1;
    init_local[0x14b3].audio_frames = -1;
    init_local[0x148e].rom.size = 0xffffffffffffffff;
    init_local[0x148f].audio_frequency = -1;
    init_local[0x148f].audio_frames = -1;
    *(undefined2 *)&init_local[0x12d2].rom.size = 0x1000;
    write_apu((Emulator *)init_local,0x16,0xf1);
    write_apu((Emulator *)init_local,1,0x80);
    write_apu((Emulator *)init_local,2,0xf3);
    write_apu((Emulator *)init_local,4,0x80);
    write_apu((Emulator *)init_local,0x14,'w');
    write_apu((Emulator *)init_local,0x15,0xf3);
    init_local[0x149a].audio_frequency = 1;
    *(undefined8 *)((long)&init_local[0x1491].cgb_color_curve + 1) =
         init_emulator::s_initial_wave_ram._0_8_;
    *(undefined8 *)((long)&init_local[0x1492].rom.data + 5) =
         init_emulator::s_initial_wave_ram._8_8_;
    *(undefined1 *)((long)&init_local[0x1494].audio_frequency + 1) = 0;
    write_io((Emulator *)init_local,0x40,0x91);
    write_io((Emulator *)init_local,0x42,'\0');
    write_io((Emulator *)init_local,0x43,'\0');
    write_io((Emulator *)init_local,0x45,'\0');
    write_io((Emulator *)init_local,0x47,0xfc);
    write_io((Emulator *)init_local,0x48,0xff);
    write_io((Emulator *)init_local,0x49,0xff);
    write_io((Emulator *)init_local,0xf,'\x01');
    write_io((Emulator *)init_local,0xff,'\0');
    *(undefined1 *)&init_local[0x14af].audio_frames = 0xff;
    emulator_set_builtin_palette((Emulator *)init_local,pEStack_20->builtin_palette);
    init_local[0x341f].force_dmg = pEStack_20->cgb_color_curve;
    for (palette._4_4_ = 0; palette._4_4_ < 2; palette._4_4_ = palette._4_4_ + 1) {
      if (palette._4_4_ == 0) {
        pEVar1 = init_local + 0x149e;
      }
      else {
        pEVar1 = init_local + 0x14a3;
      }
      local_48 = &pEVar1->audio_frames;
      _random_seed = local_48;
      for (local_34 = 0; (int)local_34 < 0x20; local_34 = local_34 + 1) {
        local_48[(long)((int)local_34 >> 2) * 4 + (long)(int)(local_34 & 3)] = -1;
        *(undefined1 *)((long)local_48 + (long)(int)(local_34 << 1) + 0x80) = 0xff;
        *(undefined1 *)((long)local_48 + (long)(int)(local_34 * 2 + 1) + 0x80) = 0x7f;
      }
    }
    local_38 = pEStack_20->random_seed;
    init_local[0x135].builtin_palette = local_38;
    randomize_buffer(&local_38,(u8 *)&init_local[0x2d1].force_dmg,0x20000);
    randomize_buffer(&local_38,(u8 *)(init_local + 3999),0x8000);
    randomize_buffer(&local_38,(u8 *)&init_local[0x14af].force_dmg,0x7f);
    init_local[0x14b3].rom.size = 4;
    calculate_next_ppu_intr((Emulator *)init_local);
    e_local._4_4_ = OK;
  }
  else {
    e_local._4_4_ = ERROR;
  }
  return e_local._4_4_;
}

Assistant:

Result init_emulator(Emulator* e, const EmulatorInit* init) {
  static u8 s_initial_wave_ram[WAVE_RAM_SIZE] = {
      0x60, 0x0d, 0xda, 0xdd, 0x50, 0x0f, 0xad, 0xed,
      0xc0, 0xde, 0xf0, 0x0d, 0xbe, 0xef, 0xfe, 0xed,
  };
  CHECK(SUCCESS(get_cart_infos(e)));
  log_cart_info(e->cart_info);
  MMAP_STATE.rom_base[0] = 0;
  MMAP_STATE.rom_base[1] = 1 << ROM_BANK_SHIFT;
  IS_CGB = !init->force_dmg && (e->cart_info->cgb_flag == CGB_FLAG_SUPPORTED ||
                                e->cart_info->cgb_flag == CGB_FLAG_REQUIRED);
  IS_SGB = !init->force_dmg && !IS_CGB &&
           e->cart_info->sgb_flag == SGB_FLAG_SUPPORTED;
  set_af_reg(e, 0xb0);
  REG.A = IS_CGB ? 0x11 : 0x01;
  REG.BC = 0x0013;
  REG.DE = 0x00d8;
  REG.HL = 0x014d;
  REG.SP = 0xfffe;
  REG.PC = 0x0100;
  INTR.ime = FALSE;
  TIMER.div_counter = 0xAC00;
  TIMER.next_intr_ticks = SERIAL.next_intr_ticks = e->state.next_intr_ticks =
      INVALID_TICKS;
  WRAM.offset = 0x1000;
  /* Enable apu first, so subsequent writes succeed. */
  write_apu(e, APU_NR52_ADDR, 0xf1);
  write_apu(e, APU_NR11_ADDR, 0x80);
  write_apu(e, APU_NR12_ADDR, 0xf3);
  write_apu(e, APU_NR14_ADDR, 0x80);
  write_apu(e, APU_NR50_ADDR, 0x77);
  write_apu(e, APU_NR51_ADDR, 0xf3);
  APU.initialized = TRUE;
  memcpy(&WAVE.ram, s_initial_wave_ram, WAVE_RAM_SIZE);
  /* Turn down the volume on channel1, it is playing by default (because of the
   * GB startup sound), but we don't want to hear it when starting the
   * emulator. */
  CHANNEL1.envelope.volume = 0;
  write_io(e, IO_LCDC_ADDR, 0x91);
  write_io(e, IO_SCY_ADDR, 0x00);
  write_io(e, IO_SCX_ADDR, 0x00);
  write_io(e, IO_LYC_ADDR, 0x00);
  write_io(e, IO_BGP_ADDR, 0xfc);
  write_io(e, IO_OBP0_ADDR, 0xff);
  write_io(e, IO_OBP1_ADDR, 0xff);
  write_io(e, IO_IF_ADDR, 0x1);
  write_io(e, IO_IE_ADDR, 0x0);
  HDMA.blocks = 0xff;

  /* Set initial DMG/SGB palettes */
  emulator_set_builtin_palette(e, init->builtin_palette);

  /* Set up cgb color curve */
  e->cgb_color_curve = init->cgb_color_curve;

  /* Set initial CGB palettes to white. */
  int pal_index;
  for (pal_index = 0; pal_index < 2; ++pal_index) {
    ColorPalettes* palette = pal_index == 0 ? &PPU.bgcp : &PPU.obcp;
    int i;
    for (i = 0; i < 32; ++i) {
      palette->palettes[i >> 2].color[i & 3] = RGBA_WHITE;
      palette->data[i * 2] = 0xff;
      palette->data[i * 2 + 1] = 0x7f;
    }
  }

  /* Randomize RAM */
  u32 random_seed = init->random_seed;
  e->state.random_seed = random_seed;
  randomize_buffer(&random_seed, e->state.ext_ram.data, EXT_RAM_MAX_SIZE);
  randomize_buffer(&random_seed, e->state.wram.data, WORK_RAM_SIZE);
  randomize_buffer(&random_seed, e->state.hram, HIGH_RAM_SIZE);

  e->state.cpu_tick = CPU_TICK;
  calculate_next_ppu_intr(e);
  return OK;
  ON_ERROR_RETURN;
}